

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall gvr::Mesh::resizeVertexList(Mesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int *piVar4;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  PointCloud *in_RDI;
  bool in_stack_0000000a;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  PointCloud *in_stack_00000010;
  int i_1;
  int i;
  float *p;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  _func_int **local_18;
  byte local_e;
  byte local_d;
  int local_c [3];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ESI * 3);
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_c[0] = in_ESI;
  local_18 = (_func_int **)operator_new__(uVar3);
  local_20 = PointCloud::getVertexCount(in_RDI);
  piVar4 = std::min<int>(&local_20,local_c);
  local_1c = *piVar4 * 3;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined4 *)((long)local_18 + (long)local_1c * 4) =
         *(undefined4 *)((long)in_RDI[1].super_Model._vptr_Model + (long)local_1c * 4);
  }
  local_28 = PointCloud::getVertexCount(in_RDI);
  piVar4 = std::min<int>(&local_28,local_c);
  for (local_24 = *piVar4 * 3; SBORROW4(local_24,local_c[0] * 3) != local_24 + local_c[0] * -3 < 0;
      local_24 = local_24 + 1) {
    *(undefined4 *)((long)local_18 + (long)local_24 * 4) = 0;
  }
  pp_Var1 = in_RDI[1].super_Model._vptr_Model;
  if (pp_Var1 != (_func_int **)0x0) {
    operator_delete__(pp_Var1);
  }
  in_RDI[1].super_Model._vptr_Model = local_18;
  PointCloud::resizeVertexList
            (in_stack_00000010,in_stack_0000000c,in_stack_0000000b,in_stack_0000000a);
  return;
}

Assistant:

void Mesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=normal[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] normal;

  normal=p;

  PointCloud::resizeVertexList(vn, with_scanprop, with_scanpos);
}